

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1067.cpp
# Opt level: O3

int main(void)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
  *this;
  iterator iVar1;
  tree *ptVar2;
  mapped_type *pptVar3;
  uint uVar4;
  ulong uVar5;
  char *__end;
  int n;
  string patch;
  string dir;
  int local_a4;
  tree *local_a0;
  undefined1 *local_98;
  ulong local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  key_type local_78;
  string local_58;
  ulong local_38;
  
  std::istream::operator>>((istream *)&std::cin,&local_a4);
  local_a0 = (tree *)operator_new(0x50);
  tree::tree(local_a0);
  if (0 < local_a4) {
    uVar5 = 0;
    do {
      local_98 = &local_88;
      local_90 = 0;
      local_88 = 0;
      std::operator>>((istream *)&std::cin,(string *)&local_98);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      local_38 = uVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
      uVar5 = 0xffffffffffffffff;
      ptVar2 = local_a0;
      do {
        if ((local_98[uVar5 + 1] == '\\') || (local_98[uVar5 + 1] == '\0')) {
          this = &ptVar2->child;
          iVar1 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                  ::find(&this->_M_t,&local_78);
          if ((_Rb_tree_header *)iVar1._M_node ==
              &(ptVar2->child)._M_t._M_impl.super__Rb_tree_header) {
            ptVar2 = (tree *)operator_new(0x50);
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,local_78._M_dataplus._M_p,
                       (char *)(local_78._M_string_length + (long)local_78._M_dataplus._M_p));
            tree::tree(ptVar2,&local_58);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            pptVar3 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                      ::operator[](this,&local_78);
            *pptVar3 = ptVar2;
            iVar1 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tree_*>_>_>
                    ::find(&this->_M_t,&local_78);
          }
          ptVar2 = *(tree **)(iVar1._M_node + 2);
          std::__cxx11::string::_M_replace
                    ((ulong)&local_78,0,(char *)local_78._M_string_length,0x103005);
        }
        else {
          std::__cxx11::string::push_back((char)&local_78);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar5 = local_38;
      if (local_98 != &local_88) {
        operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
      }
      uVar4 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar4;
    } while ((int)uVar4 < local_a4);
  }
  print_tr(local_a0,0);
  return 0;
}

Assistant:

int main() {
    int n;
    std::cin >> n;

    tree *tr_root = new tree();

    for (int i = 0; i < n; ++i) {
        std::string patch;
        std::cin >> patch;
        std::string dir = "";

        tree *tr = tr_root;
        for (int j = 0; j <= patch.size(); ++j) {
            if (patch[j] == '\\' || patch[j] == '\0') {
                auto dir_tr = tr->child.find(dir);
                if (dir_tr == tr->child.end()){
                    tree *new_tree = new tree(dir);
                    tr->child[dir] = new_tree;
                    tr = tr->child.find(dir)->second;
                } else {
                    tr = dir_tr->second;
                }
                dir = "";
            } else {
                dir += patch[j];
            }
        }

    }
    print_tr(tr_root, 0);
    return 0;
}